

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddTriangleFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImU32 col)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  if (0xffffff < col) {
    iVar6 = (this->_Path).Size;
    iVar5 = (this->_Path).Capacity;
    if (iVar6 == iVar5) {
      iVar6 = iVar6 + 1;
      if (iVar5 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar5 / 2 + iVar5;
      }
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar5 < iVar6) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar6;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *a;
    iVar5 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    iVar6 = iVar5 + 1;
    (this->_Path).Size = iVar6;
    if (iVar6 == iVar4) {
      iVar5 = iVar5 + 2;
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      if (iVar4 < iVar5) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar5;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *b;
    iVar5 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    iVar6 = iVar5 + 1;
    (this->_Path).Size = iVar6;
    if (iVar6 == iVar4) {
      iVar5 = iVar5 + 2;
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      if (iVar4 < iVar5) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar5;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *c;
    iVar6 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar6;
    AddConvexPolyFilled(this,(this->_Path).Data,iVar6,col);
    iVar6 = (this->_Path).Capacity;
    if (iVar6 < 0) {
      uVar3 = iVar6 / 2 + iVar6;
      uVar7 = 0;
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc(uVar7 * 8);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = (int)uVar7;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddTriangleFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathFillConvex(col);
}